

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O0

void __thiscall
Equality_variableEqualAllTestedConditionsVariant1_Test::
Equality_variableEqualAllTestedConditionsVariant1_Test
          (Equality_variableEqualAllTestedConditionsVariant1_Test *this)

{
  Equality_variableEqualAllTestedConditionsVariant1_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Equality_variableEqualAllTestedConditionsVariant1_Test_00149590;
  return;
}

Assistant:

TEST(Equality, variableEqualAllTestedConditionsVariant1)
{
    libcellml::VariablePtr v1 = libcellml::Variable::create();
    libcellml::VariablePtr v2 = libcellml::Variable::create();

    v1->setName("variable");
    v2->setName("variable");

    v1->setInitialValue(3.0);
    v2->setInitialValue("3");

    v1->setInterfaceType(libcellml::Variable::InterfaceType::PUBLIC);
    v2->setInterfaceType(libcellml::Variable::InterfaceType::PUBLIC);

    v1->setUnits("ampere");
    v2->setUnits("ampere");

    EXPECT_TRUE(v1->equals(v2));
    EXPECT_TRUE(v2->equals(v1));
}